

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::Assembler::align(Assembler *this,AlignMode alignMode,uint32_t alignment)

{
  bool bVar1;
  byte *pbVar2;
  uint in_EDX;
  byte in_SIL;
  BaseAssembler *in_RDI;
  StringTmp<128UL> sb;
  uint8_t *src;
  uint32_t n;
  uint8_t pattern;
  Error _err;
  CodeWriter writer;
  uint32_t i;
  StringTmp<128UL> *in_stack_fffffffffffffdf8;
  Array<unsigned_char,_4UL> *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  BaseAssembler *in_stack_fffffffffffffe10;
  String *in_stack_fffffffffffffe18;
  BaseAssembler *in_stack_fffffffffffffe20;
  StringTmp<128UL> *this_00;
  CodeWriter *in_stack_fffffffffffffe28;
  uint local_1c8;
  bool local_1c2;
  StringTmp<128UL> local_1b8;
  undefined1 auStack_1b7 [7];
  ulong local_1b0;
  undefined1 *local_1a0;
  uint8_t *local_110;
  undefined4 local_108;
  uint local_104;
  uchar local_fd;
  Error local_fc;
  CodeWriter local_f8;
  uint local_ec;
  uint local_e8;
  byte local_e1;
  Error local_d8;
  undefined4 local_d4;
  undefined4 *local_c8;
  uint *local_c0;
  long local_a8;
  StringTmp<128UL> *local_a0;
  ulong local_98;
  undefined1 local_89;
  StringTmp<128UL> *local_88;
  undefined4 local_7c;
  Logger *local_78;
  uint *local_70;
  char *local_68;
  String *local_60;
  StringTmp<128UL> *local_58;
  Logger *local_50;
  long local_40;
  undefined4 local_34;
  FormatOptions *local_30;
  StringTmp<128UL> *local_28;
  StringTmp<128UL> *local_20;
  StringTmp<128UL> *local_18;
  StringTmp<128UL> *local_10;
  StringTmp<128UL> *local_8;
  
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::errored(5);
    local_d8 = BaseEmitter::reportError
                         (&in_stack_fffffffffffffe10->super_BaseEmitter,
                          (Error)(in_stack_fffffffffffffe08 >> 0x20),
                          (char *)in_stack_fffffffffffffe00);
  }
  else if (in_SIL < 3) {
    if (in_EDX < 2) {
      local_d8 = 0;
    }
    else {
      local_1c2 = (in_EDX == 0 || (in_EDX & in_EDX - 1) != 0) || 0x40 < in_EDX;
      if (local_1c2) {
        DebugUtils::errored(2);
        local_d8 = BaseEmitter::reportError
                             (&in_stack_fffffffffffffe10->super_BaseEmitter,
                              (Error)(in_stack_fffffffffffffe08 >> 0x20),
                              (char *)in_stack_fffffffffffffe00);
      }
      else {
        local_a8 = (long)in_RDI->_bufferPtr - (long)in_RDI->_bufferData;
        local_ec = ((int)local_a8 + (in_EDX - 1) & (in_EDX - 1 ^ 0xffffffff)) - (int)local_a8;
        local_e8 = in_EDX;
        local_40 = local_a8;
        if (local_ec != 0) {
          local_e1 = in_SIL;
          CodeWriter::CodeWriter(&local_f8,in_RDI);
          local_fc = CodeWriter::ensureSpace
                               (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                                (size_t)in_stack_fffffffffffffe18);
          if (local_fc != 0) {
            return local_fc;
          }
          local_fd = '\0';
          if (local_e1 == 0) {
            local_d4 = 2;
            bVar1 = Support::test<asmjit::v1_14::EncodingOptions,asmjit::v1_14::EncodingOptions>
                              ((in_RDI->super_BaseEmitter)._encodingOptions,kOptimizedAlign);
            if (bVar1) {
              do {
                local_108 = 9;
                local_c0 = &local_ec;
                local_c8 = &local_108;
                if (local_ec < 10) {
                  local_1c8 = local_ec;
                }
                else {
                  local_1c8 = 9;
                }
                local_104 = local_1c8;
                local_ec = local_ec - local_1c8;
                local_110 = align::nopData[local_1c8 - 1];
                do {
                  CodeWriter::emit8<unsigned_char>(&local_f8,*local_110);
                  local_104 = local_104 - 1;
                  local_110 = local_110 + 1;
                } while (local_104 != 0);
              } while (local_ec != 0);
              local_104 = 0;
            }
            local_fd = 0x90;
          }
          else if (local_e1 == 1) {
            local_fd = 0xcc;
          }
          for (; local_ec != 0; local_ec = local_ec - 1) {
            CodeWriter::emit8<unsigned_char>(&local_f8,local_fd);
          }
          CodeWriter::done((CodeWriter *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        }
        if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
          this_00 = &local_1b8;
          local_a0 = this_00;
          local_8 = this_00;
          memset(this_00,0,0x20);
          StringTmp<128UL>::_resetToTemporary(this_00);
          local_78 = (in_RDI->super_BaseEmitter)._logger;
          local_7c = 0;
          local_30 = &local_78->_options;
          local_34 = 0;
          pbVar2 = Support::Array<unsigned_char,_4UL>::
                   operator[]<asmjit::v1_14::FormatIndentationGroup>
                             (in_stack_fffffffffffffe00,
                              (FormatIndentationGroup *)in_stack_fffffffffffffdf8);
          local_98 = (ulong)*pbVar2;
          local_88 = &local_1b8;
          local_89 = 0x20;
          String::_opChars(in_stack_fffffffffffffe18,
                           (ModifyOp)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                           (char)((ulong)in_stack_fffffffffffffe10 >> 0x18),
                           in_stack_fffffffffffffe08);
          local_60 = (String *)&local_1b8;
          local_68 = "align %u\n";
          local_70 = &local_e8;
          String::_opFormat(local_60,kAppend,"align %u\n",(ulong)local_e8);
          local_50 = (in_RDI->super_BaseEmitter)._logger;
          local_58 = &local_1b8;
          if ((byte)local_1b8 < 0x1f) {
            local_1a0 = auStack_1b7;
            local_1b0 = (ulong)(byte)local_1b8;
          }
          local_28 = local_58;
          local_20 = local_58;
          local_18 = local_58;
          local_10 = local_58;
          (*local_50->_vptr_Logger[2])(local_50,local_1a0,local_1b0);
          StringTmp<128UL>::~StringTmp(in_stack_fffffffffffffdf8);
        }
        local_d8 = 0;
      }
    }
  }
  else {
    DebugUtils::errored(2);
    local_d8 = BaseEmitter::reportError
                         (&in_stack_fffffffffffffe10->super_BaseEmitter,
                          (Error)(in_stack_fffffffffffffe08 >> 0x20),
                          (char *)in_stack_fffffffffffffe00);
  }
  return local_d8;
}

Assistant:

Error Assembler::align(AlignMode alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(uint32_t(alignMode) > uint32_t(AlignMode::kMaxValue)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i > 0) {
    CodeWriter writer(this);
    ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

    uint8_t pattern = 0x00;
    switch (alignMode) {
      case AlignMode::kCode: {
        if (hasEncodingOption(EncodingOptions::kOptimizedAlign)) {
          // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
          enum { kMaxNopSize = 9 };

          static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
            { 0x90 },
            { 0x66, 0x90 },
            { 0x0F, 0x1F, 0x00 },
            { 0x0F, 0x1F, 0x40, 0x00 },
            { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
          };

          do {
            uint32_t n = Support::min<uint32_t>(i, kMaxNopSize);
            const uint8_t* src = nopData[n - 1];

            i -= n;
            do {
              writer.emit8(*src++);
            } while (--n);
          } while (i);
        }

        pattern = 0x90;
        break;
      }

      case AlignMode::kData:
        pattern = 0xCC;
        break;

      case AlignMode::kZero:
        // Pattern already set to zero.
        break;
    }

    while (i) {
      writer.emit8(pattern);
      i--;
    }

    writer.done(this);
  }

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatIndentationGroup::kCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}